

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

PHYSFS_Io * memoryIo_duplicate(PHYSFS_Io *io)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  PHYSFS_Io *pPVar3;
  undefined8 *puVar4;
  long lVar5;
  PHYSFS_Io *pPVar6;
  byte bVar7;
  
  bVar7 = 0;
  puVar1 = (undefined8 *)io->opaque;
  lVar5 = puVar1[3];
  if (lVar5 != 0) {
    if (*(long *)(*(long *)(lVar5 + 8) + 0x18) != 0) {
      __assert_fail("(!parent) || (!((MemoryIoInfo *) parent->opaque)->parent)",
                    "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs.c"
                    ,0x130,"PHYSFS_Io *memoryIo_duplicate(PHYSFS_Io *)");
    }
    pPVar3 = (PHYSFS_Io *)(**(code **)(lVar5 + 0x38))();
    return pPVar3;
  }
  pPVar3 = (PHYSFS_Io *)(*__PHYSFS_AllocatorHooks.Malloc)(0x50);
  if (pPVar3 != (PHYSFS_Io *)0x0) {
    puVar4 = (undefined8 *)(*__PHYSFS_AllocatorHooks.Malloc)(0x30);
    if (puVar4 != (undefined8 *)0x0) {
      LOCK();
      *(int *)(puVar1 + 4) = *(int *)(puVar1 + 4) + 1;
      UNLOCK();
      puVar4[4] = 0;
      puVar4[5] = 0;
      puVar4[2] = 0;
      puVar4[3] = 0;
      *puVar4 = 0;
      puVar4[1] = 0;
      *puVar4 = *puVar1;
      puVar4[1] = puVar1[1];
      puVar4[2] = 0;
      puVar4[3] = io;
      *(undefined4 *)(puVar4 + 4) = 0;
      puVar4[5] = 0;
      pPVar6 = pPVar3;
      for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
        uVar2 = *(undefined4 *)&io->field_0x4;
        pPVar6->version = io->version;
        *(undefined4 *)&pPVar6->field_0x4 = uVar2;
        io = (PHYSFS_Io *)((long)io + (ulong)bVar7 * -0x10 + 8);
        pPVar6 = (PHYSFS_Io *)((long)pPVar6 + (ulong)bVar7 * -0x10 + 8);
      }
      pPVar3->opaque = puVar4;
      return pPVar3;
    }
    (*__PHYSFS_AllocatorHooks.Free)(pPVar3);
  }
  PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
  return (PHYSFS_Io *)0x0;
}

Assistant:

static PHYSFS_Io *memoryIo_duplicate(PHYSFS_Io *io)
{
    MemoryIoInfo *info = (MemoryIoInfo *) io->opaque;
    MemoryIoInfo *newinfo = NULL;
    PHYSFS_Io *parent = info->parent;
    PHYSFS_Io *retval = NULL;

    /* avoid deep copies. */
    assert((!parent) || (!((MemoryIoInfo *) parent->opaque)->parent) );

    /* share the buffer between duplicates. */
    if (parent != NULL)  /* dup the parent, increment its refcount. */
        return parent->duplicate(parent);

    /* we're the parent. */

    retval = (PHYSFS_Io *) allocator.Malloc(sizeof (PHYSFS_Io));
    BAIL_IF(!retval, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    newinfo = (MemoryIoInfo *) allocator.Malloc(sizeof (MemoryIoInfo));
    if (!newinfo)
    {
        allocator.Free(retval);
        BAIL(PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    } /* if */

    (void) __PHYSFS_ATOMIC_INCR(&info->refcount);

    memset(newinfo, '\0', sizeof (*info));
    newinfo->buf = info->buf;
    newinfo->len = info->len;
    newinfo->pos = 0;
    newinfo->parent = io;
    newinfo->refcount = 0;
    newinfo->destruct = NULL;

    memcpy(retval, io, sizeof (*retval));
    retval->opaque = newinfo;
    return retval;
}